

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcHieGia.c
# Opt level: O0

Gia_Man_t * Gia_ManSweepHierarchy(Gia_Man_t *p)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  uint uVar4;
  Vec_Int_t *p_00;
  Gia_Man_t *p_01;
  char *pcVar5;
  Gia_Obj_t *pGVar6;
  Gia_Obj_t *pObj_00;
  Gia_Man_t *pGVar7;
  bool bVar8;
  int local_50;
  int local_4c;
  int CountReals [2];
  int iFanin;
  int i;
  Gia_Obj_t *pObjNewR;
  Gia_Obj_t *pObjNew;
  Gia_Obj_t *pObj;
  Gia_Man_t *pTemp;
  Gia_Man_t *pNew;
  Vec_Int_t *vMap;
  Gia_Man_t *p_local;
  
  iVar1 = Gia_ManObjNum(p);
  p_00 = Vec_IntStart(iVar1);
  memset(&local_50,0,8);
  iVar1 = Gia_ManObjNum(p);
  p_01 = Gia_ManStart(iVar1);
  pcVar5 = Abc_UtilStrsav(p->pName);
  p_01->pName = pcVar5;
  pcVar5 = Abc_UtilStrsav(p->pSpec);
  p_01->pSpec = pcVar5;
  pGVar6 = Gia_ManConst0(p);
  pGVar6->Value = 0;
  Gia_ManHashAlloc(p_01);
  CountReals[1] = 1;
  while( true ) {
    bVar8 = false;
    if (CountReals[1] < p->nObjs) {
      pObjNew = Gia_ManObj(p,CountReals[1]);
      bVar8 = pObjNew != (Gia_Obj_t *)0x0;
    }
    if (!bVar8) break;
    iVar1 = Gia_ObjIsBuf(pObjNew);
    if (iVar1 == 0) {
      iVar1 = Gia_ObjIsAnd(pObjNew);
      if (iVar1 == 0) {
        iVar1 = Gia_ObjIsCi(pObjNew);
        if (iVar1 == 0) {
          iVar1 = Gia_ObjIsCo(pObjNew);
          if (iVar1 != 0) {
            iVar1 = Gia_ObjFanin0Copy(pObjNew);
            uVar2 = Gia_ManAppendCo(p_01,iVar1);
            pObjNew->Value = uVar2;
          }
        }
        else {
          uVar2 = Gia_ManAppendCi(p_01);
          pObjNew->Value = uVar2;
        }
      }
      else {
        iVar1 = Gia_ObjFanin0Copy(pObjNew);
        iVar3 = Gia_ObjFanin1Copy(pObjNew);
        uVar2 = Gia_ManHashAnd(p_01,iVar1,iVar3);
        pObjNew->Value = uVar2;
      }
    }
    else {
      iVar1 = Gia_ObjFanin0Copy(pObjNew);
      uVar2 = Gia_ManAppendBuf(p_01,iVar1);
      pObjNew->Value = uVar2;
      iVar1 = Abc_Lit2Var(pObjNew->Value);
      pGVar6 = Gia_ManObj(p_01,iVar1);
      CountReals[0] = Gia_ObjFaninId0p(p_01,pGVar6);
      if (CountReals[0] == 0) {
        uVar2 = Gia_ObjFaninC0(pGVar6);
        pObjNew->Value = uVar2;
        local_50 = local_50 + 1;
        iVar1 = Gia_ObjId(p_01,pGVar6);
        Gia_ManPatchBufDriver(p_01,iVar1,0);
      }
      else {
        iVar3 = Vec_IntEntry(p_00,CountReals[0]);
        iVar1 = CountReals[0];
        if (iVar3 == 0) {
          iVar3 = Gia_ObjId(p_01,pGVar6);
          Vec_IntWriteEntry(p_00,iVar1,iVar3);
        }
        else {
          iVar1 = Vec_IntEntry(p_00,CountReals[0]);
          pObj_00 = Gia_ManObj(p_01,iVar1);
          iVar1 = Vec_IntEntry(p_00,CountReals[0]);
          uVar2 = Gia_ObjFaninC0(pObj_00);
          uVar4 = Gia_ObjFaninC0(pGVar6);
          uVar2 = Abc_Var2Lit(iVar1,uVar2 ^ uVar4);
          pObjNew->Value = uVar2;
          local_4c = local_4c + 1;
          iVar1 = Gia_ObjId(p_01,pGVar6);
          Gia_ManPatchBufDriver(p_01,iVar1,0);
        }
      }
    }
    CountReals[1] = CountReals[1] + 1;
  }
  Gia_ManHashStop(p_01);
  iVar1 = Gia_ManRegNum(p);
  Gia_ManSetRegNum(p_01,iVar1);
  pGVar7 = Gia_ManCleanup(p_01);
  Gia_ManStop(p_01);
  Vec_IntFree(p_00);
  return pGVar7;
}

Assistant:

Gia_Man_t * Gia_ManSweepHierarchy( Gia_Man_t * p )
{
    Vec_Int_t * vMap = Vec_IntStart( Gia_ManObjNum(p) );
    Gia_Man_t * pNew, * pTemp;
    Gia_Obj_t * pObj, * pObjNew, * pObjNewR;
    int i, iFanin, CountReals[2] = {0};

    // duplicate AIG while propagating constants and equivalences 
    pNew = Gia_ManStart( Gia_ManObjNum(p) );
    pNew->pName = Abc_UtilStrsav( p->pName );
    pNew->pSpec = Abc_UtilStrsav( p->pSpec );
    Gia_ManConst0(p)->Value = 0;
    Gia_ManHashAlloc( pNew );
    Gia_ManForEachObj1( p, pObj, i )
    {
        if ( Gia_ObjIsBuf(pObj) )
        {
            pObj->Value = Gia_ManAppendBuf( pNew, Gia_ObjFanin0Copy(pObj) );
            pObjNew = Gia_ManObj( pNew, Abc_Lit2Var(pObj->Value) );
            iFanin = Gia_ObjFaninId0p( pNew, pObjNew );
            if ( iFanin == 0 )
            {
                pObj->Value = Gia_ObjFaninC0(pObjNew);
                CountReals[0]++;
                Gia_ManPatchBufDriver( pNew, Gia_ObjId(pNew, pObjNew), 0 );
            }
            else if ( Vec_IntEntry(vMap, iFanin) )
            {
                pObjNewR = Gia_ManObj( pNew, Vec_IntEntry(vMap, iFanin) );
                pObj->Value = Abc_Var2Lit( Vec_IntEntry(vMap, iFanin), Gia_ObjFaninC0(pObjNewR) ^ Gia_ObjFaninC0(pObjNew) );
                CountReals[1]++;
                Gia_ManPatchBufDriver( pNew, Gia_ObjId(pNew, pObjNew), 0 );
            }
            else
                Vec_IntWriteEntry( vMap, iFanin, Gia_ObjId(pNew, pObjNew) );
        }
        else if ( Gia_ObjIsAnd(pObj) )
            pObj->Value = Gia_ManHashAnd( pNew, Gia_ObjFanin0Copy(pObj), Gia_ObjFanin1Copy(pObj) );
        else if ( Gia_ObjIsCi(pObj) )
            pObj->Value = Gia_ManAppendCi( pNew );
        else if ( Gia_ObjIsCo(pObj) )
            pObj->Value = Gia_ManAppendCo( pNew, Gia_ObjFanin0Copy(pObj) );
    }
    Gia_ManHashStop( pNew );
    Gia_ManSetRegNum( pNew, Gia_ManRegNum(p) );
    pNew = Gia_ManCleanup( pTemp = pNew );
    Gia_ManStop( pTemp );
//    printf( "Updated %d const and %d shared.\n", CountReals[0], CountReals[1] );
    Vec_IntFree( vMap );
    return pNew;
}